

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O0

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::buildConstraintMatrix
          (BoundingBoxProjectionConstraint *this)

{
  size_t sVar1;
  MatrixDynSize *pMVar2;
  Vector2 *pVVar3;
  double *pdVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  Vector2 p1;
  Vector2 p0;
  size_t i;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffffee8;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_2,_false>
  *in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  Matrix<double,_2,_1,_0,_2,_1> *in_stack_ffffffffffffff00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff08;
  MatrixDynSize *pMVar7;
  VectorFixSize<2U> local_30;
  VectorFixSize<2U> local_20;
  MatrixDynSize *local_10;
  
  sVar1 = Polygon2D::getNrOfVertices((Polygon2D *)0x168501);
  iDynTree::MatrixDynSize::resize(in_RDI + 0x20,sVar1);
  Polygon2D::getNrOfVertices((Polygon2D *)0x16852d);
  iDynTree::VectorDynSize::resize(in_RDI + 0x48);
  local_10 = (MatrixDynSize *)0x0;
  while( true ) {
    pMVar7 = local_10;
    pMVar2 = (MatrixDynSize *)Polygon2D::getNrOfVertices((Polygon2D *)0x168561);
    if (pMVar2 <= pMVar7) break;
    pVVar3 = Polygon2D::operator()
                       ((Polygon2D *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    local_20.m_data[0] = pVVar3->m_data[0];
    local_20.m_data[1] = pVVar3->m_data[1];
    VectorFixSize<2U>::VectorFixSize(&local_30);
    pMVar7 = local_10;
    sVar1 = Polygon2D::getNrOfVertices((Polygon2D *)0x1685c7);
    if (pMVar7 == (MatrixDynSize *)(sVar1 - 1)) {
      pVVar3 = Polygon2D::operator()
                         ((Polygon2D *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
      local_30.m_data[0] = pVVar3->m_data[0];
      local_30.m_data[1] = pVVar3->m_data[1];
    }
    else {
      pVVar3 = Polygon2D::operator()
                         ((Polygon2D *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
      local_30.m_data[0] = pVVar3->m_data[0];
      local_30.m_data[1] = pVVar3->m_data[1];
    }
    pdVar4 = VectorFixSize<2U>::operator()(&local_30,1);
    in_stack_fffffffffffffee8 = (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)*pdVar4;
    VectorFixSize<2U>::operator()(&local_20,1);
    pdVar4 = VectorFixSize<2U>::operator()(&local_20,0);
    in_stack_fffffffffffffef0 =
         (Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,_2,_false>
          *)*pdVar4;
    VectorFixSize<2U>::operator()(&local_30,0);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (double *)in_stack_fffffffffffffef0);
    toEigen(pMVar7);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<1,2>(in_stack_ffffffffffffff08,(Index)in_stack_ffffffffffffff00,
               (Index)in_stack_fffffffffffffef8);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,1,2,false>::
    operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    pdVar4 = VectorFixSize<2U>::operator()(&local_20,0);
    in_stack_ffffffffffffff00 = (Matrix<double,_2,_1,_0,_2,_1> *)*pdVar4;
    pdVar4 = VectorFixSize<2U>::operator()(&local_30,1);
    in_stack_ffffffffffffff08 =
         (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
          *)*pdVar4;
    in_stack_fffffffffffffef8 = VectorFixSize<2U>::operator()(&local_30,0);
    in_stack_fffffffffffffef8 = (double *)*in_stack_fffffffffffffef8;
    pdVar4 = VectorFixSize<2U>::operator()(&local_20,1);
    dVar6 = (double)in_stack_fffffffffffffef8 * *pdVar4;
    dVar5 = (double)in_stack_ffffffffffffff00 * (double)in_stack_ffffffffffffff08;
    pdVar4 = (double *)
             iDynTree::VectorDynSize::operator()((VectorDynSize *)(in_RDI + 0x48),(ulong)local_10);
    *pdVar4 = dVar5 + -dVar6;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedBoundingBox.getNrOfVertices(),2);
        b.resize(projectedBoundingBox.getNrOfVertices());

        // We assume that the vertices in projectedBoundingBox are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedBoundingBox.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedBoundingBox(i);
            Vector2 p1;

            if ( i != projectedBoundingBox.getNrOfVertices()-1 )
            {
                p1 = projectedBoundingBox(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedBoundingBox(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }